

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.cpp
# Opt level: O0

int __thiscall soplex::NameSet::remove(NameSet *this,char *__filename)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  Name nam;
  int i;
  Name local_20;
  int local_14;
  char *local_10;
  NameSet *local_8;
  
  local_14 = 0;
  local_10 = __filename;
  local_8 = this;
  while( true ) {
    iVar3 = local_14;
    iVar2 = DataSet<int>::num(&this->set);
    if (iVar2 <= iVar3) break;
    if (*(int *)(local_10 + (long)local_14 * 4) < 0) {
      pcVar1 = this->mem;
      piVar4 = DataSet<int>::operator[](&this->set,local_14);
      Name::Name(&local_20,pcVar1 + *piVar4);
      DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::remove
                (&this->hashtab,(char *)&local_20);
    }
    local_14 = local_14 + 1;
  }
  iVar3 = DataSet<int>::remove(&this->set,local_10);
  return iVar3;
}

Assistant:

void NameSet::remove(int dstat[])
{
   for(int i = 0; i < set.num(); i++)
   {
      if(dstat[i] < 0)
      {
         const Name nam = &mem[set[i]];
         hashtab.remove(nam);
      }
   }

   set.remove(dstat);

   assert(isConsistent());
}